

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O2

void __thiscall capnp::compiler::ModuleLoader::ModuleImpl::~ModuleImpl(ModuleImpl *this)

{
  kj::ArrayBuilder<capnp::compiler::Resolution>::dispose(&(this->resolutions).builder);
  kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>::dispose(&(this->lineBreaks).ptr);
  kj::Array<char>::~Array(&(this->sourceNameStr).content);
  kj::Array<kj::String>::~Array(&(this->path).parts);
  kj::Own<const_kj::ReadableFile,_std::nullptr_t>::dispose(&this->file);
  return;
}

Assistant:

ModuleImpl(ModuleLoader::Impl& loader, kj::Own<const kj::ReadableFile> file,
             const kj::ReadableDirectory& sourceDir, kj::Path pathParam)
      : loader(loader), file(kj::mv(file)), sourceDir(sourceDir), path(kj::mv(pathParam)),
        sourceNameStr(path.toString()) {
    KJ_REQUIRE(path.size() > 0);
  }